

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t * archive_entry_acl_text_w(archive_entry *entry,wchar_t flags)

{
  wchar_t *pwVar1;
  
  pwVar1 = (entry->acl).acl_text_w;
  if (pwVar1 != (wchar_t *)0x0) {
    free(pwVar1);
    (entry->acl).acl_text_w = (wchar_t *)0x0;
  }
  if ((flags & 0x300U) == 0) {
    pwVar1 = (wchar_t *)0x0;
  }
  else {
    pwVar1 = archive_acl_to_text_w
                       (&entry->acl,(ssize_t *)0x0,(uint)flags >> 10 & 3 | flags | 8,entry->archive)
    ;
    (entry->acl).acl_text_w = pwVar1;
  }
  return pwVar1;
}

Assistant:

const wchar_t *
archive_entry_acl_text_w(struct archive_entry *entry, int flags)
{
	if (entry->acl.acl_text_w != NULL) {
		free(entry->acl.acl_text_w);
		entry->acl.acl_text_w = NULL;
	}
	if (archive_entry_acl_text_compat(&flags) == 0)
		entry->acl.acl_text_w = archive_acl_to_text_w(&entry->acl,
		    NULL, flags, entry->archive);
	return (entry->acl.acl_text_w);
}